

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O3

void compact_int16_suite::test_array16_int16(void)

{
  value vVar1;
  value_type expected [4];
  value_type input [7];
  decoder decoder;
  value local_64;
  value local_60 [2];
  uchar local_58 [8];
  decoder local_50;
  
  local_50.input._M_str = local_58;
  local_58[4] = '4';
  local_58[5] = 'V';
  local_58[6] = 'x';
  local_58[0] = 0xba;
  local_58[1] = '\x04';
  local_58[2] = '\0';
  local_58[3] = '\x12';
  local_50.input._M_len = 7;
  local_50.current.view._M_len = 0;
  local_50.current.view._M_str = (uchar *)0x0;
  local_50.current.code = end;
  trial::protocol::bintoken::detail::decoder::next(&local_50);
  local_64 = local_50.current.code;
  local_60[0] = 0xba;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::array16_int16",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x72d,"void compact_int16_suite::test_array16_int16()",&local_64,local_60);
  local_64 = trial::protocol::bintoken::token::symbol::convert(local_50.current.code);
  local_60[0] = array;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::symbol::value,trial::protocol::bintoken::token::symbol::value>
            ("decoder.symbol()","token::symbol::array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x72e,"void compact_int16_suite::test_array16_int16()",&local_64,local_60);
  vVar1 = trial::protocol::bintoken::token::symbol::convert(local_50.current.code);
  local_64 = end;
  if (vVar1 - null < 0xc) {
    local_64 = *(value *)(&DAT_00124a00 + (ulong)(vVar1 - null) * 4);
  }
  local_60[0] = null;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::category::value,trial::protocol::bintoken::token::category::value>
            ("decoder.category()","token::category::data",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x72f,"void compact_int16_suite::test_array16_int16()",&local_64,local_60);
  local_64 = 0x78563412;
  boost::detail::
  test_all_with_impl<std::ostream,unsigned_char_const*,unsigned_char_const*,std::equal_to<unsigned_char>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x735,"void compact_int16_suite::test_array16_int16()",local_50.current.view._M_str,
             local_50.current.view._M_str + local_50.current.view._M_len,&local_64,local_60);
  trial::protocol::bintoken::detail::decoder::next(&local_50);
  local_60[0] = local_50.current.code;
  local_60[1] = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x737,"void compact_int16_suite::test_array16_int16()",local_60,local_60 + 1);
  return;
}

Assistant:

void test_array16_int16()
{
    const value_type input[] = { token::code::array16_int16, 0x04, 0x00, 0x12, 0x34, 0x56, 0x78 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::array16_int16);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.symbol(), token::symbol::array);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.category(), token::category::data);
    const value_type expected[] = {
        0x12, 0x34, 0x56, 0x78
    };
    TRIAL_PROTOCOL_TEST_ALL_WITH(decoder.literal().begin(), decoder.literal().end(),
                                 expected, expected + sizeof(expected),
                                 std::equal_to<value_type>());
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}